

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O0

bool sentencepiece::TrainerSpec_ModelType_Parse(ConstStringParam name,TrainerSpec_ModelType *value)

{
  bool bVar1;
  int *in_R9;
  StringPiece name_00;
  StringPiece local_30;
  TrainerSpec_ModelType local_1c;
  bool success;
  TrainerSpec_ModelType *pTStack_18;
  int int_value;
  TrainerSpec_ModelType *value_local;
  ConstStringParam name_local;
  
  pTStack_18 = value;
  value_local = (TrainerSpec_ModelType *)name;
  google::protobuf::StringPiece::StringPiece<std::allocator<char>>(&local_30,name);
  name_00.length_ = (stringpiece_ssize_type)&local_1c;
  name_00.ptr_ = (char *)local_30.length_;
  bVar1 = google::protobuf::internal::LookUpEnumValue
                    ((internal *)TrainerSpec_ModelType_entries,(EnumEntry *)0x4,
                     (size_t)local_30.ptr_,name_00,in_R9);
  if (bVar1) {
    *pTStack_18 = local_1c;
  }
  return bVar1;
}

Assistant:

bool TrainerSpec_ModelType_Parse(
    ::PROTOBUF_NAMESPACE_ID::ConstStringParam name, TrainerSpec_ModelType* value) {
  int int_value;
  bool success = ::PROTOBUF_NAMESPACE_ID::internal::LookUpEnumValue(
      TrainerSpec_ModelType_entries, 4, name, &int_value);
  if (success) {
    *value = static_cast<TrainerSpec_ModelType>(int_value);
  }
  return success;
}